

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void print_help_options(TidyDoc tdoc)

{
  ctmbstr ptVar1;
  size_t sVar2;
  tmbstr c1;
  ulong local_58;
  tmbstr name_1;
  size_t len;
  ctmbstr name;
  uint width;
  uint col2;
  uint col1;
  CmdOptDesc *pos;
  CmdOptCategory cat;
  TidyDoc tdoc_local;
  
  for (pos._4_4_ = CmdOptCatFIRST; pos._4_4_ != CmdOptCatLAST; pos._4_4_ = pos._4_4_ + CmdOptProcDir
      ) {
    ptVar1 = tidyLocalizedString(cmdopt_catname[pos._4_4_].key);
    sVar2 = strlen(ptVar1);
    if (sVar2 < 0x4f) {
      local_58 = strlen(ptVar1);
    }
    else {
      local_58 = 0x4e;
    }
    printf("%s\n",ptVar1);
    printf("%*.*s\n",local_58 & 0xffffffff,local_58 & 0xffffffff,
           "-----------------------------------------------------------------");
    for (_col2 = cmdopt_defs; _col2->name1 != (ctmbstr)0x0; _col2 = _col2 + 1) {
      if (_col2->cat == pos._4_4_) {
        c1 = get_option_names(_col2);
        ptVar1 = tidyLocalizedString(_col2->key);
        print2Columns(" %-*.*s %-*.*s\n",0x1a,0x32,c1,ptVar1);
        free(c1);
      }
    }
    printf(anon_var_dwarf_13102 + 0x15d);
  }
  return;
}

Assistant:

static void print_help_options( TidyDoc tdoc )
{
    CmdOptCategory cat = CmdOptCatFIRST;
    const CmdOptDesc* pos = cmdopt_defs;
    uint col1, col2;
    uint width = 78;

    for( cat=CmdOptCatFIRST; cat!=CmdOptCatLAST; ++cat)
    {
        ctmbstr name = tidyLocalizedString(cmdopt_catname[cat].key);
        size_t len = width < strlen(name) ? width : strlen(name);
        printf( "%s\n", name );
        printf( "%*.*s\n", (int)len, (int)len, helpul );

        /* Tidy's "standard" 78-column output was always 25:52 ratio, so let's
           try to preserve this approximately 1:2 ratio regardless of whatever
           silly thing the user might have set for a console width, with a
           maximum of 50 characters for the first column.
         */
        col1 = width / 3;             /* one third of the available */
        col1 = col1 < 1 ? 1 : col1;   /* at least 1 */
        col1 = col1 > 35 ? 35 : col1; /* no greater than 35 */
        col2 = width - col1 - 2;      /* allow two spaces */
        col2 = col2 < 1 ? 1 : col2;   /* at least 1 */

        for( pos=cmdopt_defs; pos->name1; ++pos)
        {
            tmbstr name;
            if (pos->cat != cat)
                continue;
            name = get_option_names( pos );
            print2Columns( helpfmt, col1, col2, name, tidyLocalizedString( pos->key ) );
            free(name);
        }
        printf("\n");
    }
}